

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O2

bool __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
::IsInHeap(EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
           *this,void *address)

{
  bool bVar1;
  AutoRealOrFakeCriticalSection<CriticalSection> local_20;
  AutoRealOrFakeCriticalSection<CriticalSection> autocs;
  
  local_20.cs = &this->criticalSection;
  CCLock::Enter(&(local_20.cs)->super_CCLock);
  bVar1 = Memory::CustomHeap::
          Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::IsInHeap
                    (&this->allocationHeap,address);
  AutoRealOrFakeCriticalSection<CriticalSection>::~AutoRealOrFakeCriticalSection(&local_20);
  return bVar1;
}

Assistant:

bool EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::IsInHeap(__in void* address)
{
    AutoRealOrFakeCriticalSection<SyncObject> autocs(&this->criticalSection);
    return this->allocationHeap.IsInHeap(address);
}